

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btShapeHull.cpp
# Opt level: O0

bool __thiscall btShapeHull::buildHull(btShapeHull *this,btScalar param_2)

{
  long *plVar1;
  undefined8 uVar2;
  btScalar bVar3;
  HullError HVar4;
  btVector3 *pbVar5;
  uint *puVar6;
  btAlignedObjectArray<btVector3> *in_RDI;
  undefined8 in_XMM1_Qa;
  HullResult hr;
  HullLibrary hl;
  HullDesc hd;
  int i;
  btVector3 supportPoints [62];
  btVector3 norm;
  int i_1;
  int numPDA;
  int numSampleDirections;
  undefined4 in_stack_fffffffffffffa98;
  uint in_stack_fffffffffffffa9c;
  HullResult *in_stack_fffffffffffffaa0;
  HullResult *in_stack_fffffffffffffab0;
  btVector3 *in_stack_fffffffffffffab8;
  btAlignedObjectArray<btVector3> *this_00;
  btVector3 *local_518;
  btVector3 local_500;
  undefined4 local_4f0;
  int local_4dc;
  btAlignedObjectArray<btVector3> local_4d8;
  undefined4 local_4b4;
  btAlignedObjectArray<unsigned_int> local_4b0 [3];
  HullDesc local_450;
  undefined8 local_42c;
  int local_41c;
  btVector3 local_418 [17];
  HullResult *in_stack_fffffffffffffd00;
  HullDesc *in_stack_fffffffffffffd08;
  HullLibrary *in_stack_fffffffffffffd10;
  undefined1 auStack_38 [16];
  undefined8 local_28;
  int local_20;
  int local_1c;
  uint local_18;
  byte local_1;
  
  local_18 = 0x2a;
  local_1c = (**(code **)(**(long **)&in_RDI[2].m_capacity + 0xa8))();
  if (local_1c != 0) {
    for (local_20 = 0; local_20 < local_1c; local_20 = local_20 + 1) {
      btVector3::btVector3((btVector3 *)(auStack_38 + 8));
      (**(code **)(**(long **)&in_RDI[2].m_capacity + 0xb0))
                (*(long **)&in_RDI[2].m_capacity,local_20,auStack_38 + 8);
      pbVar5 = getUnitSpherePoints();
      *(undefined8 *)pbVar5[(int)local_18].m_floats = auStack_38._8_8_;
      *(undefined8 *)(pbVar5[(int)local_18].m_floats + 2) = local_28;
      local_18 = local_18 + 1;
    }
  }
  local_518 = local_418;
  do {
    btVector3::btVector3(local_518);
    local_518 = local_518 + 1;
  } while (local_518 != (btVector3 *)auStack_38);
  for (local_41c = 0; local_41c < (int)local_18; local_41c = local_41c + 1) {
    plVar1 = *(long **)&in_RDI[2].m_capacity;
    pbVar5 = getUnitSpherePoints();
    local_42c = (**(code **)(*plVar1 + 0x80))(plVar1,pbVar5 + local_41c);
    *(undefined8 *)local_418[local_41c].m_floats = local_42c;
    *(undefined8 *)(local_418[local_41c].m_floats + 2) = in_XMM1_Qa;
  }
  HullDesc::HullDesc(&local_450);
  local_450.mFlags = 1;
  local_450.mVcount = local_18;
  local_450.mVertices = local_418;
  local_450.mVertexStride = 0x10;
  HullLibrary::HullLibrary((HullLibrary *)in_stack_fffffffffffffab0);
  HullResult::HullResult(in_stack_fffffffffffffab0);
  HVar4 = HullLibrary::CreateConvexHull
                    (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
  if (HVar4 == QE_FAIL) {
    local_1 = 0;
  }
  else {
    this_00 = in_RDI;
    btVector3::btVector3(&local_500);
    btAlignedObjectArray<btVector3>::resize
              (this_00,(int)((ulong)in_stack_fffffffffffffab8 >> 0x20),
               (btVector3 *)in_stack_fffffffffffffab0);
    for (local_41c = 0; local_41c < local_4dc; local_41c = local_41c + 1) {
      in_stack_fffffffffffffab8 = btAlignedObjectArray<btVector3>::operator[](&local_4d8,local_41c);
      in_stack_fffffffffffffab0 =
           (HullResult *)btAlignedObjectArray<btVector3>::operator[](in_RDI,local_41c);
      uVar2 = *(undefined8 *)in_stack_fffffffffffffab8->m_floats;
      in_stack_fffffffffffffab0->mPolygons = (bool)(char)uVar2;
      *(int3 *)&in_stack_fffffffffffffab0->field_0x1 = (int3)((ulong)uVar2 >> 8);
      in_stack_fffffffffffffab0->mNumOutputVertices = (int)((ulong)uVar2 >> 0x20);
      bVar3 = in_stack_fffffffffffffab8->m_floats[3];
      *(btScalar *)&(in_stack_fffffffffffffab0->m_OutputVertices).field_0x0 =
           in_stack_fffffffffffffab8->m_floats[2];
      (in_stack_fffffffffffffab0->m_OutputVertices).m_size = (int)bVar3;
    }
    *(undefined4 *)(in_RDI + 2) = local_4b4;
    btAlignedObjectArray<unsigned_int>::resize
              ((btAlignedObjectArray<unsigned_int> *)this_00,
               (int)((ulong)in_stack_fffffffffffffab8 >> 0x20),(uint *)in_stack_fffffffffffffab0);
    for (local_41c = 0; local_41c < *(int *)(in_RDI + 2); local_41c = local_41c + 1) {
      puVar6 = btAlignedObjectArray<unsigned_int>::operator[](local_4b0,local_41c);
      in_stack_fffffffffffffa9c = *puVar6;
      in_stack_fffffffffffffaa0 =
           (HullResult *)
           btAlignedObjectArray<unsigned_int>::operator[]
                     ((btAlignedObjectArray<unsigned_int> *)(in_RDI + 1),local_41c);
      *(uint *)in_stack_fffffffffffffaa0 = in_stack_fffffffffffffa9c;
    }
    HullLibrary::ReleaseResult
              ((HullLibrary *)in_stack_fffffffffffffaa0,
               (HullResult *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
    local_1 = 1;
  }
  local_4f0 = 1;
  HullResult::~HullResult(in_stack_fffffffffffffaa0);
  HullLibrary::~HullLibrary((HullLibrary *)in_stack_fffffffffffffaa0);
  return (bool)(local_1 & 1);
}

Assistant:

bool
btShapeHull::buildHull (btScalar /*margin*/)
{
	int numSampleDirections = NUM_UNITSPHERE_POINTS;
	{
		int numPDA = m_shape->getNumPreferredPenetrationDirections();
		if (numPDA)
		{
			for (int i=0;i<numPDA;i++)
			{
				btVector3 norm;
				m_shape->getPreferredPenetrationDirection(i,norm);
				getUnitSpherePoints()[numSampleDirections] = norm;
				numSampleDirections++;
			}
		}
	}

	btVector3 supportPoints[NUM_UNITSPHERE_POINTS+MAX_PREFERRED_PENETRATION_DIRECTIONS*2];
	int i;
	for (i = 0; i < numSampleDirections; i++)
	{
		supportPoints[i] = m_shape->localGetSupportingVertex(getUnitSpherePoints()[i]);
	}

	HullDesc hd;
	hd.mFlags = QF_TRIANGLES;
	hd.mVcount = static_cast<unsigned int>(numSampleDirections);

#ifdef BT_USE_DOUBLE_PRECISION
	hd.mVertices = &supportPoints[0];
	hd.mVertexStride = sizeof(btVector3);
#else
	hd.mVertices = &supportPoints[0];
	hd.mVertexStride = sizeof (btVector3);
#endif

	HullLibrary hl;
	HullResult hr;
	if (hl.CreateConvexHull (hd, hr) == QE_FAIL)
	{
		return false;
	}

	m_vertices.resize (static_cast<int>(hr.mNumOutputVertices));


	for (i = 0; i < static_cast<int>(hr.mNumOutputVertices); i++)
	{
		m_vertices[i] = hr.m_OutputVertices[i];
	}
	m_numIndices = hr.mNumIndices;
	m_indices.resize(static_cast<int>(m_numIndices));
	for (i = 0; i < static_cast<int>(m_numIndices); i++)
	{
		m_indices[i] = hr.m_Indices[i];
	}

	// free temporary hull result that we just copied
	hl.ReleaseResult (hr);

	return true;
}